

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsStoreGeometryStages::Write<tcu::Vector<float,4>>
          (BasicAllFormatsStoreGeometryStages *this,GLenum internalformat,
          Vector<float,_4> *write_value,Vector<float,_4> *expected_value)

{
  CallLogWrapper *this_00;
  _Alloc_hider _Var1;
  _Alloc_hider _Var2;
  long *src_tes;
  long *plVar3;
  _func_int **pp_Var4;
  bool bVar5;
  GLuint program;
  GLint GVar6;
  ostream *poVar7;
  ShaderImageLoadStoreBase *this_01;
  char *pcVar8;
  GLenum internalformat_00;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  GLenum e_02;
  GLenum e_03;
  Vector<float,_4> *v;
  Vector<float,_4> *v_00;
  int i;
  long lVar9;
  void *this_02;
  ulong uVar10;
  bool bVar11;
  string local_2c8;
  string local_2a8;
  GLuint texture [4];
  char local_278;
  undefined7 uStack_277;
  BasicAllFormatsStoreGeometryStages *local_268;
  Vector<float,_4> *local_260;
  long *local_258;
  long *local_250;
  long local_240 [2];
  long *local_230;
  long local_220 [2];
  long *local_210;
  long local_200 [2];
  long *local_1f0;
  long local_1e0 [2];
  ostringstream os;
  undefined8 local_58;
  undefined8 uStack_50;
  _func_int **local_48;
  Functions *pFStack_40;
  
  this_02 = (void *)(ulong)internalformat;
  local_268 = this;
  local_260 = expected_value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&os,"#version 420 core\nlayout(",0x19);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_2a8,this_02,e);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,") writeonly uniform ",0x14);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_local_buf[0] = '\0';
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_2c8._M_dataplus._M_p,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "image2DArray g_image0;\nvoid main() {\n  ivec3 coord = ivec3(gl_VertexID, 0, 0);\n  imageStore(g_image0, coord, "
             ,0x6d);
  texture[2] = 0;
  texture[3] = 0;
  local_278 = '\0';
  texture._0_8_ = &local_278;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_278,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"vec4",4);
  poVar7 = tcu::operator<<(poVar7,write_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,");\n}",4);
  if ((char *)texture._0_8_ != &local_278) {
    operator_delete((void *)texture._0_8_,CONCAT71(uStack_277,local_278) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                             local_2c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  plVar3 = local_1f0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            (&os.super_basic_ostream<char,_std::char_traits<char>_>,
             "#version 420 core\nlayout(vertices = 1) out;\nlayout(",0x33);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2a8,(void *)(ulong)internalformat,e_00);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,") writeonly uniform ",0x14);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_local_buf[0] = '\0';
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_2c8._M_dataplus._M_p,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "image2DArray g_image1;\nvoid main() {\n  gl_TessLevelInner[0] = 1;\n  gl_TessLevelInner[1] = 1;\n  gl_TessLevelOuter[0] = 1;\n  gl_TessLevelOuter[1] = 1;\n  gl_TessLevelOuter[2] = 1;\n  gl_TessLevelOuter[3] = 1;\n  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);\n  imageStore(g_image1, coord, "
             ,0x118);
  texture[2] = 0;
  texture[3] = 0;
  local_278 = '\0';
  texture._0_8_ = &local_278;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_278,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"vec4",4);
  poVar7 = tcu::operator<<(poVar7,write_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,");\n}",4);
  if ((char *)texture._0_8_ != &local_278) {
    operator_delete((void *)texture._0_8_,CONCAT71(uStack_277,local_278) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                             local_2c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  local_258 = plVar3;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  plVar3 = local_210;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            (&os.super_basic_ostream<char,_std::char_traits<char>_>,
             "#version 420 core\nlayout(triangles, point_mode) in;\nlayout(",0x3b);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_2a8,this_02,e_01);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,") writeonly uniform ",0x14);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_local_buf[0] = '\0';
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_2c8._M_dataplus._M_p,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "image2DArray g_image2;\nvoid main() {\n  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);\n  imageStore(g_image2, coord, "
             ,0x70);
  texture[2] = 0;
  texture[3] = 0;
  local_278 = '\0';
  texture._0_8_ = &local_278;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_278,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"vec4",4);
  poVar7 = tcu::operator<<(poVar7,write_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,");\n}",4);
  if ((char *)texture._0_8_ != &local_278) {
    operator_delete((void *)texture._0_8_,CONCAT71(uStack_277,local_278) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                             local_2c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  src_tes = local_230;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            (&os.super_basic_ostream<char,_std::char_traits<char>_>,
             "#version 420 core\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nlayout("
             ,0x52);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2a8,(void *)(ulong)internalformat,e_02);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,") writeonly uniform ",0x14);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_local_buf[0] = '\0';
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_2c8._M_dataplus._M_p,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "image2DArray g_image3;\nvoid main() {\n  ivec3 coord = ivec3(gl_PrimitiveIDIn, 0, 0);\n  imageStore(g_image3, coord, "
             ,0x72);
  texture[2] = 0;
  texture[3] = 0;
  local_278 = '\0';
  texture._0_8_ = &local_278;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_278,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"vec4",4);
  poVar7 = tcu::operator<<(poVar7,write_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,");\n}",4);
  if ((char *)texture._0_8_ != &local_278) {
    operator_delete((void *)texture._0_8_,CONCAT71(uStack_277,local_278) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                             local_2c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  program = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                      ((ShaderImageLoadStoreBase *)local_268,(char *)local_258,(char *)plVar3,
                       (char *)src_tes,(char *)local_250,(char *)0x0,(bool *)0x0);
  if (local_250 != local_240) {
    operator_delete(local_250,local_240[0] + 1);
  }
  if (local_230 != local_220) {
    operator_delete(local_230,local_220[0] + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  this_01 = (ShaderImageLoadStoreBase *)operator_new(0x10);
  (this_01->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  (this_01->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_gl = (Functions *)0x0;
  this_00 = (CallLogWrapper *)(local_268 + 8);
  glu::CallLogWrapper::glGenTextures(this_00,4,texture);
  lVar9 = 0;
  do {
    glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,texture[lVar9]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D(this_00,0x8c1a,0,internalformat,1,1,1,0,0x1908,0x1406,this_01)
    ;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image0");
  glu::CallLogWrapper::glUniform1i(this_00,GVar6,0);
  GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image1");
  glu::CallLogWrapper::glUniform1i(this_00,GVar6,1);
  GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image2");
  glu::CallLogWrapper::glUniform1i(this_00,GVar6,2);
  GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image3");
  glu::CallLogWrapper::glUniform1i(this_00,GVar6,3);
  lVar9 = 0;
  do {
    glu::CallLogWrapper::glBindImageTexture
              (this_00,(GLuint)lVar9,texture[lVar9],0,'\x01',0,0x88b9,internalformat);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(local_268 + 0x28));
  glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,1);
  glu::CallLogWrapper::glDrawArrays(this_00,0xe,0,1);
  glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,3);
  uVar10 = 0;
  bVar11 = false;
  do {
    glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,texture[uVar10]);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
    internalformat_00 = 0x1908;
    glu::CallLogWrapper::glGetTexImage(this_00,0x8c1a,0,0x1908,0x1406,this_01);
    bVar5 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                      (this_01,local_260,(vec4 *)(ulong)internalformat,internalformat_00);
    if (!bVar5) {
      glu::CallLogWrapper::glDeleteTextures(this_00,4,texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
      local_48 = (this_01->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper;
      pFStack_40 = (this_01->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_gl;
      ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>((string *)&os,&local_48,v);
      pp_Var4 = os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
      local_58 = *(undefined8 *)local_260->m_data;
      uStack_50 = *(undefined8 *)(local_260->m_data + 2);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>(&local_2a8,&local_58,v_00);
      _Var2._M_p = local_2a8._M_dataplus._M_p;
      ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_2c8,this_02,e_03);
      _Var1._M_p = local_2c8._M_dataplus._M_p;
      pcVar8 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                         ((ShaderImageLoadStoreBase *)(uVar10 & 0xffffffff),internalformat);
      gl4cts::anon_unknown_0::Output
                ("Value is: %s. Value should be: %s. Format is: %s. Stage is: %s.\n",pp_Var4,
                 _Var2._M_p,_Var1._M_p,pcVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,
                        CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                                 local_2c8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if (os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        os.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      goto LAB_009a7193;
    }
    bVar11 = 2 < uVar10;
    uVar10 = uVar10 + 1;
  } while (uVar10 != 4);
  glu::CallLogWrapper::glDeleteTextures(this_00,4,texture);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
LAB_009a7193:
  operator_delete(this_01,0x10);
  return bVar11;
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const GLuint program =
			BuildProgram(GenVS(internalformat, write_value).c_str(), GenTCS(internalformat, write_value).c_str(),
						 GenTES(internalformat, write_value).c_str(), GenGS(internalformat, write_value).c_str(), NULL);
		const int	  kSize = 1;
		std::vector<T> data(kSize * kSize);
		GLuint		   texture[4];
		glGenTextures(4, texture);

		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(GL_TEXTURE_2D_ARRAY, texture[i]);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, internalformat, kSize, kSize, 1, 0, Format<T>(), Type<T>(), &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image0"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image1"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image2"), 2);
		glUniform1i(glGetUniformLocation(program, "g_image3"), 3);
		for (GLuint i = 0; i < 4; ++i)
		{
			glBindImageTexture(i, texture[i], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		}
		glBindVertexArray(m_vao);
		glPatchParameteri(GL_PATCH_VERTICES, 1);
		glDrawArrays(GL_PATCHES, 0, 1);
		glPatchParameteri(GL_PATCH_VERTICES, 3);

		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(GL_TEXTURE_2D_ARRAY, texture[i]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D_ARRAY, 0, Format<T>(), Type<T>(), &data[0]);

			if (!Equal(data[0], expected_value, internalformat))
			{
				glDeleteTextures(4, texture);
				glUseProgram(0);
				glDeleteProgram(program);
				Output("Value is: %s. Value should be: %s. Format is: %s. Stage is: %s.\n", ToString(data[0]).c_str(),
					   ToString(expected_value).c_str(), FormatEnumToString(internalformat).c_str(), StageName(i));
				return false;
			}
		}
		glDeleteTextures(4, texture);
		glUseProgram(0);
		glDeleteProgram(program);
		return true;
	}